

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O1

void __thiscall cmGlobalGenerator::WriteSummary(cmGlobalGenerator *this)

{
  char *pcVar1;
  ostream *poVar2;
  cmGlobalGenerator *this_00;
  _Hash_node_base *p_Var3;
  string fname;
  cmGeneratedFileStream fout;
  undefined1 local_2b0 [32];
  _Alloc_hider local_290 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_280;
  
  pcVar1 = cmMakefile::GetHomeOutputDirectory
                     ((*(this->LocalGenerators).
                        super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>.
                        _M_impl.super__Vector_impl_data._M_start)->Makefile);
  std::__cxx11::string::string((string *)local_290,pcVar1,(allocator *)&stack0xfffffffffffffd90);
  std::__cxx11::string::append((char *)local_290);
  std::__cxx11::string::append((char *)local_290);
  this_00 = (cmGlobalGenerator *)&stack0xfffffffffffffd90;
  cmGeneratedFileStream::cmGeneratedFileStream
            ((cmGeneratedFileStream *)this_00,local_290[0]._M_p,false);
  p_Var3 = (this->TotalTargets)._M_h._M_before_begin._M_nxt;
  if (p_Var3 != (_Hash_node_base *)0x0) {
    do {
      if (((cmTarget *)p_Var3[5]._M_nxt)->TargetTypeValue != INTERFACE_LIBRARY) {
        WriteSummary(this_00,(cmTarget *)p_Var3[5]._M_nxt);
        cmTarget::GetSupportDirectory_abi_cxx11_((string *)local_2b0,(cmTarget *)p_Var3[5]._M_nxt);
        poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&stack0xfffffffffffffd90,(char *)local_2b0._0_8_,
                            local_2b0._8_8_);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
        this_00 = (cmGlobalGenerator *)local_2b0._0_8_;
        if ((cmGlobalGenerator *)local_2b0._0_8_ != (cmGlobalGenerator *)(local_2b0 + 0x10)) {
          operator_delete((void *)local_2b0._0_8_,local_2b0._16_8_ + 1);
        }
      }
      p_Var3 = p_Var3->_M_nxt;
    } while (p_Var3 != (_Hash_node_base *)0x0);
  }
  cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)&stack0xfffffffffffffd90);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_290[0]._M_p != &local_280) {
    operator_delete(local_290[0]._M_p,local_280._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmGlobalGenerator::WriteSummary()
{
  cmMakefile* mf = this->LocalGenerators[0]->GetMakefile();

  // Record all target directories in a central location.
  std::string fname = mf->GetHomeOutputDirectory();
  fname += cmake::GetCMakeFilesDirectory();
  fname += "/TargetDirectories.txt";
  cmGeneratedFileStream fout(fname.c_str());

  // Generate summary information files for each target.
  for(TargetMap::const_iterator ti =
        this->TotalTargets.begin(); ti != this->TotalTargets.end(); ++ti)
    {
    if ((ti->second)->GetType() == cmTarget::INTERFACE_LIBRARY)
      {
      continue;
      }
    this->WriteSummary(ti->second);
    fout << ti->second->GetSupportDirectory() << "\n";
    }
}